

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ConvexCornerOption __thiscall
ON_SubDFromMeshParameters::CopyConvexCornerTest
          (ON_SubDFromMeshParameters *this,ON_SubDFromMeshParameters source_parameters)

{
  ConvexCornerOption CVar1;
  uint maximum_convex_corner_edge_count;
  double maximum_convex_corner_angle_radians;
  ON_SubDFromMeshParameters *this_local;
  
  CVar1 = GetConvexCornerOption(&source_parameters);
  SetConvexCornerOption(this,CVar1);
  maximum_convex_corner_edge_count = MaximumConvexCornerEdgeCount(&source_parameters);
  SetMaximumConvexCornerEdgeCount(this,maximum_convex_corner_edge_count);
  maximum_convex_corner_angle_radians = MaximumConvexCornerAngleRadians(&source_parameters);
  SetMaximumConvexCornerAngleRadians(this,maximum_convex_corner_angle_radians);
  CVar1 = GetConvexCornerOption(this);
  return CVar1;
}

Assistant:

ON_SubDFromMeshParameters::ConvexCornerOption ON_SubDFromMeshParameters::CopyConvexCornerTest(
  ON_SubDFromMeshParameters source_parameters
  )
{
  SetConvexCornerOption(source_parameters.GetConvexCornerOption());
  SetMaximumConvexCornerEdgeCount(source_parameters.MaximumConvexCornerEdgeCount());
  SetMaximumConvexCornerAngleRadians(source_parameters.MaximumConvexCornerAngleRadians());
  return GetConvexCornerOption();
}